

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_mul_div_randomized_Test::~correctness_mul_div_randomized_Test
          (correctness_mul_div_randomized_Test *this)

{
  correctness_mul_div_randomized_Test *this_local;
  
  ~correctness_mul_div_randomized_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(correctness, mul_div_randomized) {
    for (unsigned itn = 0; itn != number_of_iterations; ++itn) {
        std::vector<int> multipliers;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            multipliers.push_back(myrand());

        big_integer accumulator = 1;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            accumulator *= multipliers[i];

        std::random_shuffle(multipliers.begin(), multipliers.end());

        for (size_t i = 1; i != number_of_multipliers; ++i)
            accumulator /= multipliers[i];

        EXPECT_TRUE(accumulator == multipliers[0]);
    }
}